

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_common.c
# Opt level: O0

void IoTHubTransport_AMQP_Common_Unsubscribe_DeviceTwin(IOTHUB_DEVICE_HANDLE handle)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  size_t sVar3;
  void *pvVar4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  AMQP_TRANSPORT_DEVICE_INSTANCE *registered_device;
  LIST_ITEM_HANDLE list_item;
  LOGGER_LOG l_1;
  AMQP_TRANSPORT_INSTANCE *transport;
  LOGGER_LOG l;
  IOTHUB_DEVICE_HANDLE handle_local;
  
  if (handle == (IOTHUB_DEVICE_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
                ,"IoTHubTransport_AMQP_Common_Unsubscribe_DeviceTwin",0x659,1,
                "Invalid argument (handle is NULL");
    }
  }
  else {
    sVar3 = get_number_of_registered_devices((AMQP_TRANSPORT_INSTANCE *)handle);
    if (sVar3 == 1) {
      for (registered_device =
                (AMQP_TRANSPORT_DEVICE_INSTANCE *)
                singlylinkedlist_get_head_item(*(SINGLYLINKEDLIST_HANDLE *)((long)handle + 0x28));
          registered_device != (AMQP_TRANSPORT_DEVICE_INSTANCE *)0x0;
          registered_device =
               (AMQP_TRANSPORT_DEVICE_INSTANCE *)
               singlylinkedlist_get_next_item((LIST_ITEM_HANDLE)registered_device)) {
        pvVar4 = singlylinkedlist_item_get_value((LIST_ITEM_HANDLE)registered_device);
        if (pvVar4 == (void *)0x0) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 == (LOGGER_LOG)0x0) {
            return;
          }
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
                    ,"IoTHubTransport_AMQP_Common_Unsubscribe_DeviceTwin",0x66d,1,
                    "Failed retrieving registered device information");
          return;
        }
        iVar1 = amqp_device_unsubscribe_for_twin_updates(*(AMQP_DEVICE_HANDLE *)((long)pvVar4 + 8));
        if (iVar1 != 0) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 == (LOGGER_LOG)0x0) {
            return;
          }
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
                    ,"IoTHubTransport_AMQP_Common_Unsubscribe_DeviceTwin",0x672,1,
                    "Failed unsubscribing for device Twin updates");
          return;
        }
      }
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
                  ,"IoTHubTransport_AMQP_Common_Unsubscribe_DeviceTwin",0x661,1,
                  "Device Twin not supported on device multiplexing scenario");
      }
    }
  }
  return;
}

Assistant:

void IoTHubTransport_AMQP_Common_Unsubscribe_DeviceTwin(IOTHUB_DEVICE_HANDLE handle)
{
    if (handle == NULL)
    {
        LogError("Invalid argument (handle is NULL");
    }
    else
    {
        AMQP_TRANSPORT_INSTANCE* transport = (AMQP_TRANSPORT_INSTANCE*)handle;

        if (get_number_of_registered_devices(transport) != 1)
        {
            LogError("Device Twin not supported on device multiplexing scenario");
        }
        else
        {
            LIST_ITEM_HANDLE list_item = singlylinkedlist_get_head_item(transport->registered_devices);

            while (list_item != NULL)
            {
                AMQP_TRANSPORT_DEVICE_INSTANCE* registered_device;

                if ((registered_device = (AMQP_TRANSPORT_DEVICE_INSTANCE*)singlylinkedlist_item_get_value(list_item)) == NULL)
                {
                    LogError("Failed retrieving registered device information");
                    break;
                }
                else if (amqp_device_unsubscribe_for_twin_updates(registered_device->device_handle) != RESULT_OK)
                {
                    LogError("Failed unsubscribing for device Twin updates");
                    break;
                }

                list_item = singlylinkedlist_get_next_item(list_item);
            }
        }
    }
}